

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idx2Lookup.cpp
# Opt level: O0

extent idx2::ChunkAddressToSpatial(idx2_file *Idx2,u64 ChunkAddress)

{
  long lVar1;
  u64 uVar2;
  undefined8 uVar3;
  anon_union_8_4_6ba14846_for_v2<int>_1 aVar4;
  extent eVar5;
  byte local_321;
  extent local_310;
  undefined1 local_300 [8];
  extent ChunkExtent;
  undefined8 local_2e0;
  v3i ChunkDims3;
  undefined8 local_2bc;
  v3i ChunkFrom3;
  int local_2a8;
  anon_union_8_4_6ba14846_for_v2<int>_1 local_2a0;
  v3i Brick3;
  undefined8 local_280;
  v3i BrickDims3;
  undefined8 local_260;
  v3i GroupBrick3;
  i16 BitPlane;
  i8 Subband;
  i8 Level;
  u64 Brick;
  u64 ChunkAddress_local;
  idx2_file *Idx2_local;
  int local_1c8;
  int I_1;
  undefined8 local_1b8;
  v3i Result;
  undefined8 local_17c;
  u64 local_170;
  int local_168;
  v3<int> *local_160;
  undefined8 *local_158;
  undefined8 local_14c;
  undefined8 local_140;
  uint local_138;
  undefined8 *local_130;
  anon_union_8_4_6ba14846_for_v2<int>_1 *local_128;
  undefined8 local_11c;
  undefined8 local_110;
  int local_108;
  undefined8 *local_100;
  v3i *local_f8;
  undefined8 local_f0;
  int local_e4;
  stack_array<idx2::v3<int>,_16> *local_e0;
  undefined8 *local_d8;
  undefined8 *local_d0;
  extent *local_c8;
  v3i *local_c0;
  extent *local_b8;
  byte local_a9;
  ulong uStack_a8;
  i8 I;
  uint local_9c;
  stack_array<int,_16> *local_98;
  undefined1 local_89;
  ulong local_88;
  v3i *local_80;
  undefined8 *local_78;
  undefined8 *local_70;
  int local_64;
  int local_60;
  int local_5c;
  undefined8 *local_58;
  uint local_4c;
  int local_48;
  int local_44;
  undefined8 *local_40;
  int local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  int local_1c;
  int local_18;
  int local_14;
  undefined8 *local_10;
  
  GroupBrick3.field_0.field_0.Y._0_2_ = (undefined2)(((int)ChunkAddress << 0x14) >> 0x14);
  GroupBrick3.field_0.field_0.Y._2_1_ = (byte)(ChunkAddress >> 0xc) & 0x3f;
  GroupBrick3.field_0.field_0.Y._3_1_ = (undefined1)(ChunkAddress >> 0x3c);
  local_98 = &Idx2->BricksPerChunk;
  local_9c = (uint)(char)GroupBrick3.field_0.field_0.Y._3_1_;
  if (0xf < local_9c) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,"t &idx2::stack_array<int, 16>::operator[](int) const [t = int, N = 16]");
  }
  uStack_a8 = (ulong)local_98->Arr[(int)local_9c];
  local_89 = 0xff;
  if (uStack_a8 == 0) {
    local_321 = 0xff;
  }
  else {
    lVar1 = 0x3f;
    if (uStack_a8 != 0) {
      for (; uStack_a8 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    local_321 = 0x3f - ((byte)lVar1 ^ 0x3f);
  }
  local_a9 = local_321;
  unique0x00004880 = &local_1b8;
  Result.field_0.field_0.Y = 1;
  local_1b8._0_4_ = 1;
  local_1b8._4_4_ = 1;
  Result.field_0.field_0.X = 1;
  for (local_1c8 = 0; local_1c8 < (char)GroupBrick3.field_0.field_0.Y._3_1_;
      local_1c8 = local_1c8 + 1) {
    local_14 = (int)local_1b8 * (Idx2->GroupBrick3).field_0.field_0.X;
    local_18 = local_1b8._4_4_ * (Idx2->GroupBrick3).field_0.field_0.Y;
    Result.field_0.field_0.X = Result.field_0.field_0.X * (Idx2->GroupBrick3).field_0.field_0.Z;
    local_10 = &local_17c;
    local_17c._0_4_ = local_14;
    local_17c._4_4_ = local_18;
    local_1b8 = local_17c;
    local_1c = Result.field_0.field_0.X;
  }
  stack0xfffffffffffffd90 = local_1b8;
  GroupBrick3.field_0.field_0.X = Result.field_0.field_0.X;
  local_260 = local_1b8;
  local_f8 = &Idx2->BrickDims3;
  local_100 = &local_260;
  local_5c = (local_f8->field_0).field_0.X * (int)local_1b8;
  local_60 = (Idx2->BrickDims3).field_0.field_0.Y * local_1b8._4_4_;
  BrickDims3.field_0.field_0.X = (Idx2->BrickDims3).field_0.field_0.Z * Result.field_0.field_0.X;
  local_58 = &local_f0;
  local_f0._0_4_ = local_5c;
  local_f0._4_4_ = local_60;
  local_110 = local_f0;
  stack0xfffffffffffffd70 = local_f0;
  local_280 = local_f0;
  local_108 = BrickDims3.field_0.field_0.X;
  local_88 = uStack_a8;
  local_64 = BrickDims3.field_0.field_0.X;
  join_0x00000010_0x00000000_ =
       (anon_struct_12_3_4e9264bd_for_anon_union_12_8_3dedac88_for_v3<int>_1_0)
       GetSpatialBrick(Idx2,(int)(char)GroupBrick3.field_0.field_0.Y._3_1_,
                       (ChunkAddress >> 0x12 & 0x3ffffffffff) <<
                       (local_321 + (uStack_a8 != 1L << (local_321 & 0x3f)) & 0x3f));
  Brick3.field_0.field_0.X = local_2a8;
  local_2a0 = (anon_union_8_4_6ba14846_for_v2<int>_1)ChunkFrom3.field_0.field_4.YZ.field_0;
  aVar4 = local_2a0;
  local_128 = &local_2a0;
  local_130 = &local_280;
  local_2a0.field_0.X = ChunkFrom3.field_0.field_0.Y;
  local_2a0.field_0.Y = ChunkFrom3.field_0.field_0.Z;
  local_44 = local_2a0.field_0.X * (int)local_280;
  local_48 = local_2a0.field_0.Y * local_280._4_4_;
  ChunkFrom3.field_0.field_0.X = local_2a8 * BrickDims3.field_0.field_0.X;
  local_40 = &local_11c;
  local_11c._0_4_ = local_44;
  local_11c._4_4_ = local_48;
  local_140 = local_11c;
  stack0xfffffffffffffd30 = local_11c;
  local_2bc = local_11c;
  uVar3 = local_2bc;
  local_e0 = &Idx2->BricksPerChunk3s;
  local_e4 = (int)(char)GroupBrick3.field_0.field_0.Y._3_1_;
  local_2a0 = aVar4;
  local_138 = ChunkFrom3.field_0.field_0.X;
  local_4c = ChunkFrom3.field_0.field_0.X;
  if (0xf < local_e4) {
    __assert_fail("Idx < N",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/Common.h"
                  ,0x20c,
                  "t &idx2::stack_array<idx2::v3<int>, 16>::operator[](int) const [t = idx2::v3<int>, N = 16]"
                 );
  }
  local_160 = local_e0->Arr + local_e4;
  local_158 = &local_280;
  local_2c = (int)local_280 * (local_160->field_0).field_0.X;
  local_30 = local_280._4_4_ * (local_160->field_0).field_0.Y;
  local_168 = BrickDims3.field_0.field_0.X * (local_160->field_0).field_0.Z;
  local_28 = &local_14c;
  local_14c._0_4_ = local_2c;
  local_14c._4_4_ = local_30;
  local_170 = local_14c;
  ChunkExtent.Dims = local_14c;
  local_2e0 = local_14c;
  uVar2 = local_2e0;
  local_c8 = (extent *)local_300;
  local_d0 = &local_2bc;
  local_d8 = &local_2e0;
  local_2bc._0_4_ = (uint)local_11c;
  local_2bc._4_4_ = (uint)((ulong)local_11c >> 0x20);
  local_300 = (undefined1  [8])
              ((ulong)((uint)local_2bc & 0x1fffff) | (ulong)(local_2bc._4_4_ & 0x1fffff) << 0x15 |
              (ulong)(ChunkFrom3.field_0.field_0.X & 0x1fffff) << 0x2a);
  local_2e0._0_4_ = (uint)local_14c;
  local_2e0._4_4_ = (uint)(local_14c >> 0x20);
  ChunkExtent.From =
       (ulong)((uint)local_2e0 & 0x1fffff) | (ulong)(local_2e0._4_4_ & 0x1fffff) << 0x15 |
       (ulong)(ChunkDims3.field_0.field_0.X & 0x1fffff) << 0x2a;
  local_c0 = &Idx2->Dims3;
  local_b8 = &local_310;
  local_310.From = 0;
  local_310.Dims =
       (ulong)((local_c0->field_0).field_0.X & 0x1fffff) |
       (ulong)((Idx2->Dims3).field_0.field_0.Y & 0x1fffff) << 0x15 |
       (ulong)((Idx2->Dims3).field_0.field_0.Z & 0x1fffff) << 0x2a;
  local_2e0 = uVar2;
  ChunkDims3.field_0.field_0.X = local_168;
  local_2bc = uVar3;
  local_80 = local_c0;
  local_78 = local_d8;
  local_70 = local_d0;
  local_34 = local_168;
  eVar5 = Crop<idx2::extent,idx2::extent>(local_c8,local_b8);
  return eVar5;
}

Assistant:

extent
ChunkAddressToSpatial(const idx2_file& Idx2, u64 ChunkAddress)
{
  u64 Brick;
  i8 Level;
  i8 Subband;
  i16 BitPlane;
  UnpackChunkAddress(Idx2, ChunkAddress, &Brick, &Level, &Subband, &BitPlane);
  v3i GroupBrick3 = Pow(Idx2.GroupBrick3, Level);
  v3i BrickDims3 = Idx2.BrickDims3 * GroupBrick3;
  v3i Brick3 = GetSpatialBrick(Idx2, Level, Brick);
  v3i ChunkFrom3 = Brick3 * BrickDims3;
  v3i ChunkDims3 = BrickDims3 * Idx2.BricksPerChunk3s[Level];
  extent ChunkExtent = extent(ChunkFrom3, ChunkDims3);
  return extent(Crop(ChunkExtent, extent(Idx2.Dims3)));
}